

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::texstorage3d_invalid_levels
               (NegativeTestContext *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  ContextType ctxType;
  deUint32 textures [2];
  string local_48;
  GLuint local_28 [2];
  
  local_28[0] = 0x1234;
  local_28[1] = 0x1234;
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,2,local_28);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x806f,local_28[0]);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"GL_INVALID_VALUE is generated if levels is less than 1.","");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,0,0x8058,4,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,0,0x8058,0,0,0);
  NegativeTestContext::expectError(ctx,0x501);
  if (bVar2) {
LAB_015c464d:
    glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0x9009,local_28[1]);
    glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,0,0x8058,4,4,6);
    NegativeTestContext::expectError(ctx,0x501);
    glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,0,0x8058,0,0,6);
    NegativeTestContext::expectError(ctx,0x501);
  }
  else {
    bVar3 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (bVar3) goto LAB_015c464d;
  }
  NegativeTestContext::endSection(ctx);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "GL_INVALID_OPERATION is generated if levels is greater than floor(log_2(max(width, height, depth))) + 1"
             ,"");
  NegativeTestContext::beginSection(ctx,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,8,2,2);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,2,8,2);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,2,2,8);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x806f,5,0x8058,8,8,8);
  NegativeTestContext::expectError(ctx,0x502);
  if (!bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported(ctx->m_ctxInfo,"GL_OES_texture_cube_map_array");
    if (!bVar2) goto LAB_015c4867;
  }
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,5,0x8058,2,2,6);
  NegativeTestContext::expectError(ctx,0x502);
  glu::CallLogWrapper::glTexStorage3D(&ctx->super_CallLogWrapper,0x9009,5,0x8058,8,8,6);
  NegativeTestContext::expectError(ctx,0x502);
LAB_015c4867:
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,2,local_28);
  return;
}

Assistant:

void texstorage3d_invalid_levels (NegativeTestContext& ctx)
{
	deUint32	textures[]		= {0x1234, 0x1234};
	deUint32	log2MaxSize		= deLog2Floor32(8) + 1 + 1;
	const bool	supportsES32	= contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	ctx.glGenTextures(2, textures);
	ctx.glBindTexture(GL_TEXTURE_3D, textures[0]);

	ctx.beginSection("GL_INVALID_VALUE is generated if levels is less than 1.");
	ctx.glTexStorage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 4, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexStorage3D(GL_TEXTURE_3D, 0, GL_RGBA8, 0, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);

	if (supportsES32 || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, textures[1]);
		ctx.glTexStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA8, 4, 4, 6);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.glTexStorage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, GL_RGBA8, 0, 0, 6);
		ctx.expectError(GL_INVALID_VALUE);
	}
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if levels is greater than floor(log_2(max(width, height, depth))) + 1");
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 8, 2, 2);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 2, 8, 2);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 2, 2, 8);
	ctx.expectError		(GL_INVALID_OPERATION);
	ctx.glTexStorage3D	(GL_TEXTURE_3D, log2MaxSize, GL_RGBA8, 8, 8, 8);
	ctx.expectError		(GL_INVALID_OPERATION);

	if (supportsES32 || ctx.getContextInfo().isExtensionSupported("GL_OES_texture_cube_map_array"))
	{
		ctx.glTexStorage3D	(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxSize, GL_RGBA8, 2, 2, 6);
		ctx.expectError		(GL_INVALID_OPERATION);
		ctx.glTexStorage3D	(GL_TEXTURE_CUBE_MAP_ARRAY, log2MaxSize, GL_RGBA8, 8, 8, 6);
		ctx.expectError		(GL_INVALID_OPERATION);
	}
	ctx.endSection();

	ctx.glDeleteTextures(2, textures);
}